

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O0

void anon_unknown.dwarf_61130::invertM33f(M33f *m,float e)

{
  bool bVar1;
  Matrix33<float> *in_RDI;
  M33f ident2;
  M33f ident1;
  M33f inv2;
  M33f inv1;
  float in_stack_ffffffffffffff6c;
  Matrix33<float> *in_stack_ffffffffffffff70;
  Matrix33<float> *in_stack_ffffffffffffff78;
  Matrix33<float> *in_stack_ffffffffffffffd8;
  
  Imath_3_2::Matrix33<float>::inverse(in_RDI);
  Imath_3_2::Matrix33<float>::gjInverse(in_stack_ffffffffffffffd8);
  Imath_3_2::Matrix33<float>::operator*(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Imath_3_2::Matrix33<float>::operator*(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  bVar1 = Imath_3_2::Matrix33<float>::equalWithAbsError
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  if (!bVar1) {
    __assert_fail("ident1.equalWithAbsError (identity33f, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                  ,0x32,"void (anonymous namespace)::invertM33f(const M33f &, float)");
  }
  bVar1 = Imath_3_2::Matrix33<float>::equalWithAbsError
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  if (!bVar1) {
    __assert_fail("ident2.equalWithAbsError (identity33f, e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInvert.cpp"
                  ,0x33,"void (anonymous namespace)::invertM33f(const M33f &, float)");
  }
  return;
}

Assistant:

void
invertM33f (const M33f& m, float e)
{
    M33f inv1   = m.inverse ();
    M33f inv2   = m.gjInverse ();
    M33f ident1 = m * inv1;
    M33f ident2 = m * inv2;

    //cout << "m\n" << m << endl;
    //cout << "inv1\n" << inv1 << "ident1\n" << ident1 << endl;
    //cout << "inv2\n" << inv2 << "ident2\n" << ident2 << endl;

    assert (ident1.equalWithAbsError (identity33f, e));
    assert (ident2.equalWithAbsError (identity33f, e));
}